

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

IdentPtr __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::PidAt
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,size_t iecpMin,size_t iecpLim)

{
  code *pcVar1;
  bool bVar2;
  uint32 cch;
  ulong uVar3;
  undefined4 *puVar4;
  IdentPtr pIVar5;
  
  uVar3 = (long)this->m_pchLast - (long)this->m_pchBase;
  if ((uVar3 <= iecpMin) || (iecpLim <= iecpMin || uVar3 < iecpLim)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x21f,
                       "(iecpMin < AdjustedLength() && iecpLim <= AdjustedLength() && iecpLim > iecpMin)"
                       ,
                       "iecpMin < AdjustedLength() && iecpLim <= AdjustedLength() && iecpLim > iecpMin"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  cch = UnescapeToTempBuf(this,this->m_pchBase + iecpMin,this->m_pchBase + iecpLim);
  pIVar5 = HashTbl::PidHashNameLen<char16_t>(&this->m_htbl,(this->m_tempChBuf).m_prgch,cch);
  return pIVar5;
}

Assistant:

IdentPtr Scanner<EncodingPolicy>::PidAt(size_t iecpMin, size_t iecpLim)
{
    Assert(iecpMin < AdjustedLength() && iecpLim <= AdjustedLength() && iecpLim > iecpMin);
    return PidOfIdentiferAt(m_pchBase + iecpMin, m_pchBase + iecpLim);
}